

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

MDD lddmc_makenode(uint32_t value,MDD ifeq,MDD ifneq)

{
  FILE *__stream;
  uint32_t uVar1;
  mddnode_t n_00;
  size_t sVar2;
  size_t sVar3;
  uint64_t local_48;
  uint64_t index;
  undefined1 auStack_38 [4];
  int created;
  mddnode n;
  MDD ifneq_local;
  MDD ifeq_local;
  MDD MStack_10;
  uint32_t value_local;
  
  MStack_10 = ifneq;
  if (ifeq != 0) {
    n.b = ifneq;
    if (ifneq == 1) {
      __assert_fail("ifneq != lddmc_true",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x166,"MDD lddmc_makenode(uint32_t, MDD, MDD)");
    }
    if (ifneq != 0) {
      n_00 = LDD_GETNODE(ifneq);
      uVar1 = mddnode_getvalue(n_00);
      if (uVar1 <= value) {
        __assert_fail("value < mddnode_getvalue(LDD_GETNODE(ifneq))",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x167,"MDD lddmc_makenode(uint32_t, MDD, MDD)");
      }
    }
    mddnode_make((mddnode_t)auStack_38,value,n.b,ifeq);
    local_48 = llmsset_lookup(nodes,_auStack_38,n.a,(int *)((long)&index + 4));
    if (local_48 == 0) {
      lddmc_refs_push(ifeq);
      lddmc_refs_push(n.b);
      sylvan_gc_RUN();
      lddmc_refs_pop(1);
      local_48 = llmsset_lookup(nodes,_auStack_38,n.a,(int *)((long)&index + 4));
      __stream = _stderr;
      if (local_48 == 0) {
        sVar2 = llmsset_count_marked_RUN(nodes);
        sVar3 = llmsset_get_size(nodes);
        fprintf(__stream,"MDD Unique table full, %zu of %zu buckets filled!\n",sVar2,sVar3);
        exit(1);
      }
    }
    if (index._4_4_ == 0) {
      sylvan_stats_count(3);
    }
    else {
      sylvan_stats_count(2);
    }
    MStack_10 = local_48;
  }
  return MStack_10;
}

Assistant:

MDD
lddmc_makenode(uint32_t value, MDD ifeq, MDD ifneq)
{
    if (ifeq == lddmc_false) return ifneq;

    // check if correct (should be false, or next in value)
    assert(ifneq != lddmc_true);
    if (ifneq != lddmc_false) assert(value < mddnode_getvalue(LDD_GETNODE(ifneq)));

    struct mddnode n;
    mddnode_make(&n, value, ifneq, ifeq);

    int created;
    uint64_t index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        lddmc_refs_push(ifeq);
        lddmc_refs_push(ifneq);
        RUN(sylvan_gc);
        lddmc_refs_pop(1);

        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "MDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(LDD_NODES_CREATED);
    else sylvan_stats_count(LDD_NODES_REUSED);

    return (MDD)index;
}